

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voxelizer.h
# Opt level: O1

vx_mesh_t *
vx_voxelize(vx_mesh_t *m,float voxelsizex,float voxelsizey,float voxelsizez,float precision)

{
  vx_hash_table_node_t **ppvVar1;
  size_t sVar2;
  vx_triangle_t triangle_00;
  bool bVar3;
  int iVar4;
  vx_hash_table_t *table;
  long lVar5;
  vx_vertex_t *pvVar6;
  vx_hash_table_node_t *pvVar7;
  vx_hash_table_node *pvVar8;
  vx_mesh_t *mesh;
  uint *puVar9;
  long lVar10;
  size_t sVar11;
  float *pfVar12;
  vx_vertex_t *v1;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  byte bVar16;
  uint uVar17;
  float fVar18;
  uint in_XMM0_Db;
  uint in_XMM0_Dc;
  uint in_XMM0_Dd;
  float fVar19;
  uint in_XMM1_Db;
  uint in_XMM1_Dc;
  uint in_XMM1_Dd;
  uint in_XMM2_Db;
  uint in_XMM2_Dc;
  uint in_XMM2_Dd;
  float fVar20;
  vx_vertex_t boxcenter;
  vx_vertex_t halfboxsize;
  float vertices [24];
  size_t a;
  vx_triangle_t triangle;
  float local_1d4;
  float local_1c8;
  float local_188;
  float local_184;
  float local_180;
  float local_17c;
  float local_178;
  float local_174;
  float local_170;
  float local_16c;
  float local_168;
  float local_164;
  float local_160;
  float local_15c;
  float local_158;
  float local_154;
  float local_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float local_140;
  float local_13c;
  float local_138;
  float local_134;
  float local_130;
  float local_12c;
  vx_mesh_t *local_128;
  ulong local_120;
  ulong local_118;
  anon_union_12_2_12391dad_for_vx_vertex_0 local_110;
  undefined4 uStack_104;
  undefined4 uStack_100;
  float fStack_fc;
  undefined8 uStack_f8;
  float local_f0;
  float local_e8;
  uint uStack_e4;
  uint uStack_e0;
  uint uStack_dc;
  float local_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  float local_c8;
  uint uStack_c4;
  uint uStack_c0;
  uint uStack_bc;
  float local_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  float local_a8;
  float local_98;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  float local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  float local_58;
  float fStack_54;
  uint uStack_50;
  uint uStack_4c;
  undefined1 local_48 [16];
  
  bVar16 = 0;
  local_b8 = voxelsizex * 0.5;
  local_a8 = voxelsizey * 0.5;
  local_98 = voxelsizez * 0.5;
  uStack_b4 = in_XMM0_Db;
  uStack_b0 = in_XMM0_Dc;
  uStack_ac = in_XMM0_Dd;
  table = vx__hash_table_alloc(0x1000);
  if (m->nindices == 0) {
    lVar10 = 0;
  }
  else {
    local_d8 = -voxelsizex;
    uStack_d4 = in_XMM0_Db ^ 0x80000000;
    uStack_d0 = in_XMM0_Dc ^ 0x80000000;
    uStack_cc = in_XMM0_Dd ^ 0x80000000;
    local_e8 = -voxelsizey;
    uStack_e4 = in_XMM1_Db ^ 0x80000000;
    uStack_e0 = in_XMM1_Dc ^ 0x80000000;
    uStack_dc = in_XMM1_Dd ^ 0x80000000;
    local_c8 = -voxelsizez;
    uStack_c4 = in_XMM2_Db ^ 0x80000000;
    uStack_c0 = in_XMM2_Dc ^ 0x80000000;
    uStack_bc = in_XMM2_Dd ^ 0x80000000;
    uVar13 = 0;
    lVar10 = 0;
    local_128 = m;
    do {
      pvVar6 = m->vertices;
      puVar9 = m->indices;
      local_110.v[2] = pvVar6[puVar9[uVar13]].field_0.v[2];
      local_110._0_8_ = *(undefined8 *)&pvVar6[puVar9[uVar13]].field_0;
      uStack_104 = (undefined4)*(undefined8 *)&pvVar6[puVar9[uVar13 + 1]].field_0;
      uStack_100 = (undefined4)((ulong)*(undefined8 *)&pvVar6[puVar9[uVar13 + 1]].field_0 >> 0x20);
      fStack_fc = pvVar6[puVar9[uVar13 + 1]].field_0.v[2];
      uStack_f8 = *(undefined8 *)&pvVar6[puVar9[uVar13 + 2]].field_0;
      local_f0 = pvVar6[puVar9[uVar13 + 2]].field_0.v[2];
      fVar18 = vx__triangle_area((vx_triangle_t *)&local_110.field_1);
      if (1e-07 <= fVar18) {
        local_120 = uVar13;
        vx__triangle_aabb((vx_triangle_t *)&local_110.field_1);
        fVar18 = local_184;
        local_1d4 = floorf(((float)(~-(uint)(local_188 < 0.0) & (uint)voxelsizex |
                                   -(uint)(local_188 < 0.0) & (uint)local_d8) * 0.5 + local_188) /
                           voxelsizex);
        local_1d4 = local_1d4 * voxelsizex;
        uVar17 = -(uint)(fVar18 < 0.0);
        local_188 = local_1d4;
        local_184 = floorf(((float)(~uVar17 & (uint)voxelsizey | uVar17 & (uint)local_e8) * 0.5 +
                           fVar18) / voxelsizey);
        local_184 = local_184 * voxelsizey;
        local_180 = floorf(((float)(~-(uint)(local_180 < 0.0) & (uint)voxelsizez |
                                   -(uint)(local_180 < 0.0) & (uint)local_c8) * 0.5 + local_180) /
                           voxelsizez);
        local_180 = local_180 * voxelsizez;
        fVar18 = ceilf(((float)(~-(uint)(local_17c < 0.0) & (uint)voxelsizex |
                               -(uint)(local_17c < 0.0) & (uint)local_d8) * 0.5 + local_17c) /
                       voxelsizex);
        local_17c = fVar18 * voxelsizex;
        local_178 = ceilf(((float)(~-(uint)(local_178 < 0.0) & (uint)voxelsizey |
                                  -(uint)(local_178 < 0.0) & (uint)local_e8) * 0.5 + local_178) /
                          voxelsizey);
        local_178 = local_178 * voxelsizey;
        local_174 = ceilf(((float)(~-(uint)(local_174 < 0.0) & (uint)voxelsizez |
                                  -(uint)(local_174 < 0.0) & (uint)local_c8) * 0.5 + local_174) /
                          voxelsizez);
        local_174 = local_174 * voxelsizez;
        m = local_128;
        uVar13 = local_120;
        if (local_1d4 < fVar18 * voxelsizex) {
          do {
            local_1c8 = local_184;
            if (local_184 < local_178) {
              fVar18 = ((local_1d4 - local_b8) + local_b8 + local_1d4) * 0.5;
              uStack_64 = uStack_b4 & 0x7fffffff;
              uStack_60 = uStack_b0 & 0x7fffffff;
              uStack_5c = uStack_ac & 0x7fffffff;
              local_78 = ZEXT416((uint)fVar18);
              fVar18 = fVar18 * 7.38561e+07;
              local_118 = (ulong)fVar18;
              local_68 = ABS((local_b8 + local_1d4) - (local_1d4 - local_b8)) * 0.5 + precision;
              local_118 = (long)(fVar18 - 9.223372e+18) & (long)local_118 >> 0x3f | local_118;
              do {
                if (local_180 < local_174) {
                  fVar19 = ((local_1c8 - local_a8) + local_a8 + local_1c8) * 0.5;
                  local_88._4_4_ = fVar19;
                  local_88._0_4_ = local_78._0_4_;
                  local_88._8_4_ = local_78._8_4_;
                  local_88._12_4_ = local_78._12_4_;
                  fStack_54 = ABS((local_a8 + local_1c8) - (local_1c8 - local_a8)) * 0.5 + precision
                  ;
                  local_58 = local_68;
                  uStack_50 = uStack_60;
                  uStack_4c = uStack_5c;
                  fVar19 = fVar19 * 19349664.0;
                  lVar5 = (long)fVar19;
                  uVar17 = (uint)local_118;
                  fVar18 = local_180;
                  do {
                    fVar20 = ((fVar18 - local_98) + local_98 + fVar18) * 0.5;
                    halfboxsize.field_0._8_4_ =
                         ABS((local_98 + fVar18) - (fVar18 - local_98)) * 0.5 + precision;
                    triangle_00.p2.field_0.v[0] = (float)uStack_104;
                    triangle_00.p1.field_0.v[2] = local_110.v[2];
                    triangle_00.p2.field_0.v[2] = fStack_fc;
                    triangle_00.p2.field_0.v[1] = (float)uStack_100;
                    local_48 = ZEXT416((uint)fVar20);
                    halfboxsize.field_0.v[1] = fStack_54;
                    halfboxsize.field_0.v[0] = local_58;
                    triangle_00.p1.field_0._0_8_ = local_110._0_8_;
                    triangle_00.p3.field_0._0_8_ = uStack_f8;
                    triangle_00.p3.field_0.v[2] = local_f0;
                    boxcenter.field_0._0_8_ = local_88._0_8_;
                    boxcenter.field_0.v[2] = fVar20;
                    iVar4 = vx__triangle_box_overlap(boxcenter,halfboxsize,triangle_00);
                    if (iVar4 != 0) {
                      pvVar6 = (vx_vertex_t *)malloc(0xc);
                      *(undefined8 *)&pvVar6->field_0 = local_88._0_8_;
                      (pvVar6->field_0).v[2] = (float)local_48._0_4_;
                      lVar15 = (long)((float)local_48._0_4_ * 8.349279e+07);
                      uVar14 = (((uint)lVar15 |
                                (uint)(long)((float)local_48._0_4_ * 8.349279e+07 - 9.223372e+18) &
                                (uint)(lVar15 >> 0x3f)) ^
                               ((uint)(long)(fVar19 - 9.223372e+18) & (uint)(lVar5 >> 0x3f) |
                               (uint)lVar5) ^ uVar17) & 0xfff;
                      ppvVar1 = table->elements;
                      pvVar7 = ppvVar1[uVar14];
                      if (pvVar7 == (vx_hash_table_node_t *)0x0) {
                        pvVar7 = (vx_hash_table_node_t *)malloc(0x18);
                        ppvVar1[uVar14] = pvVar7;
                        pvVar7->prev = (vx_hash_table_node *)0x0;
                        ppvVar1[uVar14]->next = (vx_hash_table_node *)0x0;
                        ppvVar1[uVar14]->data = pvVar6;
LAB_0010c3b8:
                        lVar15 = 1;
                      }
                      else {
                        v1 = (vx_vertex_t *)pvVar7->data;
                        while (bVar3 = vx__vertex_equals(v1,pvVar6), !bVar3) {
                          pvVar8 = pvVar7->next;
                          if (pvVar8 == (vx_hash_table_node *)0x0) {
                            pvVar8 = (vx_hash_table_node *)malloc(0x18);
                            pvVar8->prev = pvVar7;
                            pvVar8->next = (vx_hash_table_node *)0x0;
                            pvVar8->data = pvVar6;
                            pvVar7->next = pvVar8;
                            goto LAB_0010c3b8;
                          }
                          v1 = (vx_vertex_t *)pvVar8->data;
                          pvVar7 = pvVar8;
                        }
                        lVar15 = 0;
                      }
                      lVar10 = lVar10 + lVar15;
                    }
                    fVar18 = fVar18 + voxelsizez;
                  } while (fVar18 < local_174);
                }
                local_1c8 = local_1c8 + voxelsizey;
              } while (local_1c8 < local_178);
            }
            local_1d4 = local_1d4 + voxelsizex;
            m = local_128;
            uVar13 = local_120;
          } while (local_1d4 < local_17c);
        }
      }
      uVar13 = uVar13 + 3;
    } while (uVar13 < m->nindices);
  }
  mesh = (vx_mesh_t *)malloc(0x38);
  mesh->nnormals = 6;
  pvVar6 = (vx_vertex_t *)calloc(lVar10 * 0x60,1);
  mesh->vertices = pvVar6;
  pvVar6 = (vx_vertex_t *)calloc(0x48,1);
  mesh->normals = pvVar6;
  puVar9 = (uint *)calloc(lVar10 * 0x90,1);
  mesh->indices = puVar9;
  puVar9 = (uint *)calloc(lVar10 * 0x90,1);
  mesh->normalindices = puVar9;
  mesh->nindices = 0;
  mesh->nvertices = 0;
  pfVar12 = vx_normals;
  for (lVar10 = 0x12; lVar10 != 0; lVar10 = lVar10 + -1) {
    (pvVar6->field_0).v[0] = *pfVar12;
    pfVar12 = pfVar12 + (ulong)bVar16 * -2 + 1;
    pvVar6 = (vx_vertex_t *)((long)pvVar6 + (ulong)bVar16 * -8 + 4);
  }
  local_188 = -local_b8;
  local_184 = local_a8;
  local_180 = local_98;
  local_178 = -local_a8;
  local_174 = local_98;
  local_170 = local_b8;
  local_168 = local_98;
  local_164 = local_b8;
  local_160 = local_a8;
  local_15c = local_98;
  local_154 = local_a8;
  local_150 = -local_98;
  local_140 = local_b8;
  local_134 = local_b8;
  local_130 = local_a8;
  sVar2 = table->size;
  local_17c = local_188;
  local_16c = local_178;
  local_158 = local_188;
  fStack_14c = local_188;
  fStack_148 = local_178;
  fStack_144 = local_150;
  local_13c = local_178;
  local_138 = local_150;
  local_12c = local_150;
  if (sVar2 != 0) {
    ppvVar1 = table->elements;
    sVar11 = 0;
    do {
      pvVar7 = ppvVar1[sVar11];
      if (pvVar7 != (vx_hash_table_node_t *)0x0) {
        vx__add_voxel(mesh,(vx_vertex_t *)pvVar7->data,&local_188);
        for (pvVar8 = pvVar7->next; pvVar8 != (vx_hash_table_node *)0x0; pvVar8 = pvVar8->next) {
          vx__add_voxel(mesh,(vx_vertex_t *)pvVar8->data,&local_188);
        }
      }
      sVar11 = sVar11 + 1;
    } while (sVar11 != sVar2);
  }
  vx__hash_table_free(table,true);
  return mesh;
}

Assistant:

vx_mesh_t* vx_voxelize(vx_mesh_t* m,
    float voxelsizex,
    float voxelsizey,
    float voxelsizez,
    float precision)
{
    vx_mesh_t* outmesh = NULL;
    vx_hash_table_t* table = NULL;
    size_t voxels = 0;

    float halfsizex = voxelsizex * 0.5f;
    float halfsizey = voxelsizey * 0.5f;
    float halfsizez = voxelsizez * 0.5f;

    table = vx__hash_table_alloc(VOXELIZER_HASH_TABLE_SIZE);

    for (int i = 0; i < m->nindices; i += 3) {
        vx_triangle_t triangle;

        VX_ASSERT(m->indices[i+0] < m->nvertices);
        VX_ASSERT(m->indices[i+1] < m->nvertices);
        VX_ASSERT(m->indices[i+2] < m->nvertices);

        triangle.p1 = m->vertices[m->indices[i+0]];
        triangle.p2 = m->vertices[m->indices[i+1]];
        triangle.p3 = m->vertices[m->indices[i+2]];

        if (vx__triangle_area(&triangle) < VOXELIZER_EPSILON) {
            // triangle with 0 area
            continue;
        }

        vx_aabb_t aabb = vx__triangle_aabb(&triangle);

        aabb.min.x = vx__map_to_voxel(aabb.min.x, voxelsizex, true);
        aabb.min.y = vx__map_to_voxel(aabb.min.y, voxelsizey, true);
        aabb.min.z = vx__map_to_voxel(aabb.min.z, voxelsizez, true);

        aabb.max.x = vx__map_to_voxel(aabb.max.x, voxelsizex, false);
        aabb.max.y = vx__map_to_voxel(aabb.max.y, voxelsizey, false);
        aabb.max.z = vx__map_to_voxel(aabb.max.z, voxelsizez, false);

        for (float x = aabb.min.x; x < aabb.max.x; x += voxelsizex) {
            for (float y = aabb.min.y; y < aabb.max.y; y += voxelsizey) {
                for (float z = aabb.min.z; z < aabb.max.z; z += voxelsizez) {
                    vx_aabb_t saabb;

                    saabb.min.x = x - halfsizex;
                    saabb.min.y = y - halfsizey;
                    saabb.min.z = z - halfsizez;
                    saabb.max.x = x + halfsizex;
                    saabb.max.y = y + halfsizey;
                    saabb.max.z = z + halfsizez;

                    vx_vertex_t boxcenter = vx__aabb_center(&saabb);
                    vx_vertex_t halfsize = vx__aabb_half_size(&saabb);

                    // HACK: some holes might appear, this
                    // precision factor reduces the artifact
                    halfsize.x += precision;
                    halfsize.y += precision;
                    halfsize.z += precision;

                    if (vx__triangle_box_overlap(boxcenter, halfsize, triangle)) {
                        vx_vertex_t* nodedata = VX_MALLOC(vx_vertex_t, 1);
                        *nodedata = boxcenter;

                        size_t hash = vx__vertex_hash(boxcenter, VOXELIZER_HASH_TABLE_SIZE);

                        bool insert = vx__hash_table_insert(table,
                                hash,
                                nodedata,
                                vx__vertex_comp_func);

                        if (insert) {
                            voxels++;
                        }
                   }
                }
            }
        }
    }

    outmesh = VX_MALLOC(vx_mesh_t, 1);
    size_t nvertices = voxels * 8;
    size_t nindices = voxels * VOXELIZER_INDICES_SIZE;
    outmesh->nnormals = VOXELIZER_NORMAL_INDICES_SIZE;
    outmesh->vertices = VX_CALLOC(vx_vertex_t, nvertices);
    outmesh->normals = VX_CALLOC(vx_vertex_t, 6);
    outmesh->indices = VX_CALLOC(unsigned int, nindices);
    outmesh->normalindices = VX_CALLOC(unsigned int, nindices);
    outmesh->nindices = 0;
    outmesh->nvertices = 0;

    memcpy(outmesh->normals, vx_normals, 18 * sizeof(float));

    float vertices[24] = {
        -halfsizex,  halfsizey,  halfsizez,
        -halfsizex, -halfsizey,  halfsizez,
         halfsizex, -halfsizey,  halfsizez,
         halfsizex,  halfsizey,  halfsizez,
        -halfsizex,  halfsizey, -halfsizez,
        -halfsizex, -halfsizey, -halfsizez,
         halfsizex, -halfsizey, -halfsizez,
         halfsizex,  halfsizey, -halfsizez,
    };

    for (size_t i = 0; i < table->size; ++i) {
        if (table->elements[i] != NULL) {
            vx_hash_table_node_t* node = table->elements[i];

            if (!node) {
                continue;
            }

            vx_vertex_t* p = (vx_vertex_t*) node->data;
            vx__add_voxel(outmesh, p, vertices);

            while (node->next) {
                node = node->next;
                p = (vx_vertex_t*) node->data;
                vx__add_voxel(outmesh, p, vertices);
            }
        }
    }

    vx__hash_table_free(table, true);

    return outmesh;
}